

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O1

Page * __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FindPageToSplit(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
               BucketId targetBucket,bool findPreReservedHeapPages)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Page *this_00;
  int iVar4;
  Page *page;
  Page *local_50;
  undefined1 local_48 [8];
  EditingIterator bucketIter;
  
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  bucketIter.super_Iterator.current._4_4_ = targetBucket;
  do {
    bucketIter.super_Iterator.current._4_4_ = bucketIter.super_Iterator.current._4_4_ + Bucket256;
    if (LargeObjectList < bucketIter.super_Iterator.current._4_4_) {
      return (Page *)0x0;
    }
    local_48 = (undefined1  [8])(this->buckets + bucketIter.super_Iterator.current._4_4_);
    bucketIter.super_Iterator.list = (DListBase<Memory::CustomHeap::Page,_RealCount> *)local_48;
    do {
      if (bucketIter.super_Iterator.list == (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar2) goto LAB_006aafac;
        *puVar3 = 0;
      }
      bucketIter.super_Iterator.list =
           ((bucketIter.super_Iterator.list)->super_DListNodeBase<Memory::CustomHeap::Page>).next.
           list;
      iVar4 = 0;
      if ((undefined1  [8])bucketIter.super_Iterator.list == local_48) break;
      this_00 = DListBase<Memory::CustomHeap::Page,_RealCount>::Iterator::Data((Iterator *)local_48)
      ;
      if (this_00->inFullList == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                           ,0x307,"(!pageInBucket.inFullList)","!pageInBucket.inFullList");
        if (!bVar2) {
LAB_006aafac:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      if (findPreReservedHeapPages) {
        bVar2 = CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                ::IsPreReservedSegment(this->codePageAllocators,this_00->segment);
        iVar4 = 5;
        if (bVar2) goto LAB_006aaef9;
      }
      else {
LAB_006aaef9:
        bVar2 = Page::CanAllocate(this_00,targetBucket);
        iVar4 = 0;
        if (bVar2) {
          if ((findPreReservedHeapPages) && (DAT_015d346a == '\x01')) {
            Output::Trace(CustomHeapPhase,
                          L"PRE-RESERVE: Found page for splitting in Pre Reserved Segment\n");
          }
          if (DAT_015d346a == '\x01') {
            Output::Trace(CustomHeapPhase,L"Found page to split. Moving from bucket %d to %d\n",
                          (ulong)(uint)bucketIter.super_Iterator.current._4_4_);
          }
          local_50 = AddPageToBucket(this,this_00,targetBucket,false);
          iVar4 = 1;
        }
      }
    } while ((iVar4 == 0) || (iVar4 == 5));
    if (iVar4 != 0) {
      return local_50;
    }
  } while( true );
}

Assistant:

Page* Heap<TAlloc, TPreReservedAlloc>::FindPageToSplit(BucketId targetBucket, bool findPreReservedHeapPages)
{
    for (BucketId b = (BucketId)(targetBucket + 1); b < BucketId::NumBuckets; b = (BucketId) (b + 1))
    {
        #pragma prefast(suppress: __WARNING_UNCHECKED_LOWER_BOUND_FOR_ENUMINDEX, "targetBucket is always in range >= SmallObjectList, but an __in_range doesn't fix the warning.");
        FOREACH_DLISTBASE_ENTRY_EDITING(Page, pageInBucket, &this->buckets[b], bucketIter)
        {
            Assert(!pageInBucket.inFullList);
            if (findPreReservedHeapPages && !this->codePageAllocators->IsPreReservedSegment(pageInBucket.segment))
            {
                //Find only pages that are pre-reserved using preReservedHeapPageAllocator
                continue;
            }

            if (pageInBucket.CanAllocate(targetBucket))
            {
                Page* page = &pageInBucket;
                if (findPreReservedHeapPages)
                {
                    VerboseHeapTrace(_u("PRE-RESERVE: Found page for splitting in Pre Reserved Segment\n"));
                }
                VerboseHeapTrace(_u("Found page to split. Moving from bucket %d to %d\n"), b, targetBucket);
                return AddPageToBucket(page, targetBucket);
            }
        }
        NEXT_DLISTBASE_ENTRY_EDITING;
    }

    return nullptr;
}